

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int max_background_threads_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  size_t in_RAX;
  int iVar5;
  size_t sVar6;
  size_t oldval;
  
  oldval = in_RAX;
  duckdb_je_background_thread_ctl_init((tsdn_t *)tsd);
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_lock);
  sVar2 = duckdb_je_max_background_threads;
  if (newp == (void *)0x0) {
    oldval = duckdb_je_max_background_threads;
    iVar5 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(size_t *)oldp = duckdb_je_max_background_threads;
      }
      else {
        sVar6 = 8;
        if (uVar1 < 8) {
          sVar6 = uVar1;
        }
        switchD_0193dc74::default(oldp,&oldval,sVar6);
        *oldlenp = sVar6;
        iVar5 = 0x16;
      }
    }
  }
  else {
    iVar5 = 0x16;
    if (newlen == 8) {
      oldval = duckdb_je_max_background_threads;
      if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
        uVar1 = *oldlenp;
        if (uVar1 != 8) {
          sVar6 = 8;
          if (uVar1 < 8) {
            sVar6 = uVar1;
          }
          switchD_0193dc74::default(oldp,&oldval,sVar6);
          *oldlenp = sVar6;
          goto LAB_01e8103f;
        }
        *(size_t *)oldp = duckdb_je_max_background_threads;
      }
      uVar1 = *newp;
      sVar3 = duckdb_je_max_background_threads;
      if (uVar1 != sVar2) {
        if (duckdb_je_opt_max_background_threads < uVar1) goto LAB_01e8103f;
        sVar3 = uVar1;
        if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
          duckdb_je_background_thread_enabled_state.repr = false;
          _Var4 = duckdb_je_background_threads_disable(tsd);
          if (_Var4) {
            iVar5 = 0xe;
          }
          else {
            duckdb_je_background_thread_enabled_state.repr = true;
            duckdb_je_max_background_threads = uVar1;
            _Var4 = duckdb_je_background_threads_enable(tsd);
            iVar5 = 0xe;
            if (!_Var4) {
              iVar5 = 0;
            }
          }
          goto LAB_01e8103f;
        }
      }
      duckdb_je_max_background_threads = sVar3;
      iVar5 = 0;
    }
  }
LAB_01e8103f:
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar5;
}

Assistant:

static int
max_background_threads_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	size_t oldval;

	if (!have_background_thread) {
		return ENOENT;
	}
	background_thread_ctl_init(tsd_tsdn(tsd));

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	if (newp == NULL) {
		oldval = max_background_threads;
		READ(oldval, size_t);
	} else {
		if (newlen != sizeof(size_t)) {
			ret = EINVAL;
			goto label_return;
		}
		oldval = max_background_threads;
		READ(oldval, size_t);

		size_t newval = *(size_t *)newp;
		if (newval == oldval) {
			ret = 0;
			goto label_return;
		}
		if (newval > opt_max_background_threads) {
			ret = EINVAL;
			goto label_return;
		}

		if (background_thread_enabled()) {
			background_thread_enabled_set(tsd_tsdn(tsd), false);
			if (background_threads_disable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
			max_background_threads = newval;
			background_thread_enabled_set(tsd_tsdn(tsd), true);
			if (background_threads_enable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
		} else {
			max_background_threads = newval;
		}
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}